

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::Massacre(AActor *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FName local_3c;
  DAngle local_38;
  
  if (this->health < 1) {
    return false;
  }
  uVar1 = (this->flags).Value;
  uVar2 = (this->flags2).Value;
  (this->flags).Value = uVar1 | 4;
  (this->flags2).Value = uVar2 & 0xe7ffffff;
  do {
    iVar3 = this->health;
    local_3c.Index = 0xca;
    local_38.Degrees = 0.0;
    P_DamageMobj(this,(AActor *)0x0,(AActor *)0x0,1000000,&local_3c,0,&local_38);
    iVar4 = this->health;
    if (iVar4 == iVar3) break;
  } while (0 < iVar4);
  if (0 < iVar4) {
    (this->flags).Value = uVar1;
    (this->flags2).Value = uVar2;
  }
  return iVar4 < 1;
}

Assistant:

bool AActor::Massacre ()
{
	int prevhealth;

	if (health > 0)
	{
		auto f = flags;
		auto f2 = flags2;

		flags |= MF_SHOOTABLE;
		flags2 &= ~(MF2_DORMANT|MF2_INVULNERABLE);
		do
		{
			prevhealth = health;
			P_DamageMobj (this, NULL, NULL, TELEFRAG_DAMAGE, NAME_Massacre);
		}
		while (health != prevhealth && health > 0);	//abort if the actor wasn't hurt.
		if (health > 0)
		{
			// restore flags if this did not kill the monster.
			flags = f;
			flags2 = f2;
		}
		return health <= 0;
	}
	return false;
}